

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmemory.cpp
# Opt level: O0

SHMPTR SHMalloc(size_t size)

{
  SHMPTR shmptr;
  BOOL BVar1;
  void *pvVar2;
  SHMPTR *pSVar3;
  LPVOID pvVar4;
  SHMPTR *shmptr_ptr;
  SHM_FIRST_HEADER *header;
  SHMPTR next_free;
  SHMPTR first_free;
  SHM_POOL_SIZES sps;
  size_t size_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (size == 0) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    size_local = 0;
  }
  else {
    first_free._4_4_ = 0;
    while (((int)first_free._4_4_ < 4 && ((ulong)(long)block_sizes[first_free._4_4_] < size))) {
      first_free._4_4_ = first_free._4_4_ + 1;
    }
    if (first_free._4_4_ == 4) {
      fprintf(_stderr,"] %s %s:%d","SHMalloc",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
              ,0x247);
      fprintf(_stderr,"Got request for shared memory block of %u bytes; maximum block size is %d.\n"
              ,size,0x808);
      size_local = 0;
    }
    else {
      if (!PAL_InitializeChakraCoreCalled) {
        abort();
      }
      SHMLock();
      pvVar2 = Volatile<void_*>::Load(shm_segment_bases);
      if (*(int *)((long)pvVar2 + (ulong)first_free._4_4_ * 0x18 + 0x50) == 0) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        BVar1 = SHMAddSegment();
        if (BVar1 == 0) {
          if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
            SHMRelease();
            return 0;
          }
          abort();
        }
      }
      size_local = *(SHMPTR *)((long)pvVar2 + (ulong)first_free._4_4_ * 0x18 + 0x58);
      pSVar3 = (SHMPTR *)SHMPtrToPtr(size_local);
      if (size_local == 0) {
        fprintf(_stderr,"] %s %s:%d","SHMalloc",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
                ,0x268);
        fprintf(_stderr,"First free block in %d-byte pool (%08x) was invalid!\n",
                (ulong)(uint)block_sizes[first_free._4_4_],0);
        SHMRelease();
        size_local = 0;
      }
      else {
        shmptr = *pSVar3;
        *(SHMPTR *)((long)pvVar2 + (ulong)first_free._4_4_ * 0x18 + 0x58) = shmptr;
        *(int *)((long)pvVar2 + (ulong)first_free._4_4_ * 0x18 + 0x50) =
             *(int *)((long)pvVar2 + (ulong)first_free._4_4_ * 0x18 + 0x50) + -1;
        if (((*(int *)((long)pvVar2 + (ulong)first_free._4_4_ * 0x18 + 0x50) == 0) && (shmptr != 0))
           || ((*(int *)((long)pvVar2 + (ulong)first_free._4_4_ * 0x18 + 0x50) != 0 && (shmptr == 0)
               ))) {
          fprintf(_stderr,"] %s %s:%d","SHMalloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
                  ,0x278);
          fprintf(_stderr,"free block count is %d, but next free block is %#x\n",
                  (ulong)*(uint *)((long)pvVar2 + (ulong)first_free._4_4_ * 0x18 + 0x50),shmptr);
          *(undefined8 *)((long)pvVar2 + (ulong)first_free._4_4_ * 0x18 + 0x58) = 0;
          *(undefined4 *)((long)pvVar2 + (ulong)first_free._4_4_ * 0x18 + 0x50) = 0;
        }
        else if ((shmptr != 0) && (pvVar4 = SHMPtrToPtr(shmptr), pvVar4 == (LPVOID)0x0)) {
          fprintf(_stderr,"] %s %s:%d","SHMalloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
                  ,0x280);
          fprintf(_stderr,"Next free block (%#x) in %d-byte pool is invalid!\n",shmptr,
                  (ulong)(uint)block_sizes[first_free._4_4_]);
          *(undefined8 *)((long)pvVar2 + (ulong)first_free._4_4_ * 0x18 + 0x58) = 0;
          *(undefined4 *)((long)pvVar2 + (ulong)first_free._4_4_ * 0x18 + 0x50) = 0;
        }
        SHMRelease();
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
      }
    }
  }
  return size_local;
}

Assistant:

SHMPTR SHMalloc(size_t size)
{
    enum SHM_POOL_SIZES sps;
    SHMPTR first_free;
    SHMPTR next_free;
    SHM_FIRST_HEADER *header;
    SHMPTR *shmptr_ptr;

    TRACE("SHMalloc() called; requested size is %u\n", size);

    if(0 == size)
    {
        WARN("Got a request for a 0-byte block! returning 0\n");
        return 0;
    }

    /* Find the first block size >= requested size */
    for (sps = static_cast<SHM_POOL_SIZES>(0); sps < SPS_LAST;
         sps = static_cast<SHM_POOL_SIZES>(sps + 1))
    {
        if (size <= static_cast<size_t>(block_sizes[sps]))
        {
            break;
        }
    }

    /* If no block size is found, requested size was too large. */
    if( SPS_LAST == sps )
    {
        ASSERT("Got request for shared memory block of %u bytes; maximum block "
              "size is %d.\n", size, block_sizes[SPS_LAST-1]);
        return 0;
    }

    TRACE("Best block size is %d (%d bytes wasted)\n",
          block_sizes[sps], block_sizes[sps]-size );

    log_waste(sps, block_sizes[sps]-size);

    SHMLock();
    header = (SHM_FIRST_HEADER *)shm_segment_bases[0].Load();

    /* If there are no free items of the specified size left, it's time to
       allocate a new shared memory segment.*/
    if(header->pools[sps].free_items == 0)
    {
        TRACE("No blocks of %d bytes left; allocating new segment.\n",
              block_sizes[sps]);
        if(!SHMAddSegment())
        {
            ERROR("Unable to allocate new shared memory segment!\n");
            SHMRelease();
            return 0;
        }
    }

    /* Remove the first free block from the pool */
    first_free = header->pools[sps].first_free;
    shmptr_ptr = static_cast<SHMPTR*>(SHMPTR_TO_PTR(first_free));

    if( 0 == first_free )
    {
        ASSERT("First free block in %d-byte pool (%08x) was invalid!\n",
              block_sizes[sps], first_free);
        SHMRelease();
        return 0;
    }

    /* the block "first_free" is the head of a linked list of free blocks;
       take the next link in the list and set it as new head of list. */
    next_free = *shmptr_ptr;
    header->pools[sps].first_free = next_free;
    header->pools[sps].free_items--;

    /* make sure we're still in a sane state */
    if(( 0 == header->pools[sps].free_items && 0 != next_free) ||
       ( 0 != header->pools[sps].free_items && 0 == next_free))
    {
        ASSERT("free block count is %d, but next free block is %#x\n",
               header->pools[sps].free_items, next_free);
        /* assume all remaining blocks in the pool are corrupt */
        header->pools[sps].first_free = 0;
        header->pools[sps].free_items = 0;
    }
    else if (0 != next_free && 0 == SHMPTR_TO_PTR(next_free) )
    {
        ASSERT("Next free block (%#x) in %d-byte pool is invalid!\n",
               next_free, block_sizes[sps]);
        /* assume all remaining blocks in the pool are corrupt */
        header->pools[sps].first_free = 0;
        header->pools[sps].free_items = 0;
    }

    SHMRelease();

    TRACE("Allocation successful; %d blocks of %d bytes left. Returning %08x\n",
          header->pools[sps].free_items, block_sizes[sps], first_free);
    return first_free;
}